

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
               (CodedInputStream *input,double *value)

{
  bool bVar1;
  uint64_t temp;
  double local_10;
  
  bVar1 = io::CodedInputStream::ReadLittleEndian64(input,(uint64_t *)&local_10);
  if (bVar1) {
    *value = local_10;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<double, WireFormatLite::TYPE_DOUBLE>(
    io::CodedInputStream* input, double* value) {
  uint64_t temp;
  if (!input->ReadLittleEndian64(&temp)) return false;
  *value = DecodeDouble(temp);
  return true;
}